

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  void **ppvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptorProto *pFVar5;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  MessageOptions *this_00;
  ExtensionRange *pEVar6;
  string *element_name;
  DescriptorProto_ExtensionRange *descriptor;
  long lVar7;
  long lVar8;
  SubstituteArg *this_01;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  SubstituteArg local_100;
  SubstituteArg local_d0;
  SubstituteArg local_a0;
  string local_70;
  int local_4c;
  long lStack_48;
  int i_4;
  int64 max_extension_range;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  i_2 = 0;
  _i_1 = proto;
  proto_local = (DescriptorProto *)message;
  message_local = (Descriptor *)this;
  while( true ) {
    iVar4 = i_2;
    iVar3 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    ppvVar1 = (proto_local->extension_).super_RepeatedPtrFieldBase.elements_;
    lVar7 = (long)i_2;
    pFVar5 = DescriptorProto::field(_i_1,i_2);
    ValidateFieldOptions(this,(FieldDescriptor *)(ppvVar1 + lVar7 * 0xf),pFVar5);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar4 = i_3;
    iVar3 = Descriptor::nested_type_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    lVar7 = *(long *)&(proto_local->extension_).super_RepeatedPtrFieldBase.total_size_;
    lVar8 = (long)i_3;
    proto_00 = DescriptorProto::nested_type(_i_1,i_3);
    ValidateMessageOptions(this,(Descriptor *)(lVar7 + lVar8 * 0x78),proto_00);
    i_3 = i_3 + 1;
  }
  max_extension_range._4_4_ = 0;
  while( true ) {
    iVar4 = max_extension_range._4_4_;
    iVar3 = Descriptor::enum_type_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    lVar7 = *(long *)&(proto_local->nested_type_).super_RepeatedPtrFieldBase.current_size_;
    lVar8 = (long)max_extension_range._4_4_;
    proto_01 = DescriptorProto::enum_type(_i_1,max_extension_range._4_4_);
    ValidateEnumOptions(this,(EnumDescriptor *)(lVar7 + lVar8 * 0x38),proto_01);
    max_extension_range._4_4_ = max_extension_range._4_4_ + 1;
  }
  max_extension_range._0_4_ = 0;
  while( true ) {
    iVar4 = (int)max_extension_range;
    iVar3 = Descriptor::extension_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    lVar7 = *(long *)&(proto_local->enum_type_).super_RepeatedPtrFieldBase.total_size_;
    lVar8 = (long)(int)max_extension_range;
    pFVar5 = DescriptorProto::extension(_i_1,(int)max_extension_range);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar7 + lVar8 * 0x78),pFVar5);
    max_extension_range._0_4_ = (int)max_extension_range + 1;
  }
  this_00 = Descriptor::options((Descriptor *)proto_local);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  iVar4 = 0x1fffffff;
  if (bVar2) {
    iVar4 = 0x7fffffff;
  }
  lStack_48 = (long)iVar4;
  local_4c = 0;
  while( true ) {
    iVar4 = local_4c;
    iVar3 = Descriptor::extension_range_count((Descriptor *)proto_local);
    if (iVar3 <= iVar4) break;
    pEVar6 = Descriptor::extension_range((Descriptor *)proto_local,local_4c);
    if (lStack_48 + 1 < (long)pEVar6->end) {
      element_name = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
      descriptor = DescriptorProto::extension_range(_i_1,local_4c);
      strings::internal::SubstituteArg::SubstituteArg(&local_a0,lStack_48);
      strings::internal::SubstituteArg::SubstituteArg(&local_d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_100);
      strings::internal::SubstituteArg::SubstituteArg(&local_130);
      strings::internal::SubstituteArg::SubstituteArg(&local_160);
      strings::internal::SubstituteArg::SubstituteArg(&local_190);
      strings::internal::SubstituteArg::SubstituteArg(&local_1c0);
      this_01 = &local_1f0;
      strings::internal::SubstituteArg::SubstituteArg(this_01);
      strings::internal::SubstituteArg::SubstituteArg(&local_220);
      strings::internal::SubstituteArg::SubstituteArg(&local_250);
      strings::Substitute_abi_cxx11_
                (&local_70,(strings *)"Extension numbers cannot be greater than $0.",
                 (char *)&local_a0,&local_d0,&local_100,&local_130,&local_160,&local_190,&local_1c0,
                 this_01,&local_220,&local_250,this_01);
      AddError(this,element_name,&descriptor->super_Message,NUMBER,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format() ?
                         kint32max :
                         FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}